

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

void Fra_BmcPerform(Fra_Man_t *p,int nPref,int nDepth)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  Fra_Cla_t *pFVar3;
  uint uVar4;
  uint uVar5;
  abctime aVar6;
  Fra_Bmc_t *pFVar7;
  Aig_Man_t *pAVar8;
  void *pvVar9;
  abctime aVar10;
  uint uVar11;
  int iVar12;
  
  aVar6 = Abc_Clock();
  if (p->pBmc == (Fra_Bmc_t *)0x0) {
    pFVar7 = Fra_BmcStart(p->pManAig,nPref,nDepth);
    p->pBmc = pFVar7;
    iVar12 = 0;
    pAVar8 = Fra_BmcFrames(pFVar7,0);
    pFVar7 = p->pBmc;
    pFVar7->pAigFrames = pAVar8;
    pVVar2 = p->pCla->vImps;
    uVar11 = 0;
    if (pVVar2 != (Vec_Int_t *)0x0) {
      pAVar8->pImpFunc = Fra_BmcFilterImplications;
      pAVar8->pImpData = pFVar7;
      pFVar7->vImps = pVVar2;
      uVar11 = pVVar2->nSize;
    }
    pAVar8 = Fra_FraigEquivence(pAVar8,1000000,0);
    pFVar7 = p->pBmc;
    pFVar7->pAigFraig = pAVar8;
    pAVar8 = pFVar7->pAigFrames;
    pFVar7->pObjToFraig = pAVar8->pObjCopies;
    pAVar8->pObjCopies = (Aig_Obj_t **)0x0;
    for (; iVar12 < pAVar8->vObjs->nSize; iVar12 = iVar12 + 1) {
      pvVar9 = Vec_PtrEntry(pAVar8->vObjs,iVar12);
      if (pvVar9 != (void *)0x0) {
        *(Fra_Man_t **)((long)pvVar9 + 0x28) = p;
      }
      pFVar7 = p->pBmc;
      pAVar8 = pFVar7->pAigFrames;
    }
    if (p->pPars->fVerbose != 0) {
      iVar12 = 0x8e3730;
      printf("Original AIG = %d. Init %d frames = %d. Fraig = %d.  ",
             (ulong)(uint)(pFVar7->pAig->nObjs[6] + pFVar7->pAig->nObjs[5]),
             (ulong)(uint)pFVar7->nFramesAll,(ulong)(uint)(pAVar8->nObjs[6] + pAVar8->nObjs[5]),
             (ulong)(uint)(pFVar7->pAigFraig->nObjs[6] + pFVar7->pAigFraig->nObjs[5]));
      Abc_Print(iVar12,"%s =","Time");
      aVar10 = Abc_Clock();
      Abc_Print(iVar12,"%9.2f sec\n",(double)(aVar10 - aVar6) / 1000000.0);
      printf("Before BMC: ");
      pFVar3 = p->pCla;
      uVar1 = pFVar3->vClasses1->nSize;
      uVar5 = pFVar3->vClasses->nSize;
      uVar4 = Fra_ClassesCountLits(pFVar3);
      printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar1,(ulong)uVar5,(ulong)uVar4);
      if (p->pCla->vImps != (Vec_Int_t *)0x0) {
        printf("Imp = %5d. ",(ulong)uVar11);
      }
      putchar(10);
    }
    pFVar3 = p->pCla;
    pFVar3->pFuncNodeIsConst = Fra_BmcNodeIsConst;
    pFVar3->pFuncNodesAreEqual = Fra_BmcNodesAreEqual;
    Fra_ClassesRefine(pFVar3);
    Fra_ClassesRefine1(p->pCla,1,(int *)0x0);
    pFVar3 = p->pCla;
    pFVar3->pFuncNodeIsConst = Fra_SmlNodeIsConst;
    pFVar3->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    if (p->pPars->fVerbose != 0) {
      printf("After  BMC: ");
      pFVar3 = p->pCla;
      uVar11 = pFVar3->vClasses1->nSize;
      uVar1 = pFVar3->vClasses->nSize;
      uVar5 = Fra_ClassesCountLits(pFVar3);
      printf("Const = %5d. Class = %5d. Lit = %5d. ",(ulong)uVar11,(ulong)uVar1,(ulong)uVar5);
      pVVar2 = p->pCla->vImps;
      if (pVVar2 != (Vec_Int_t *)0x0) {
        printf("Imp = %5d. ",(ulong)(uint)pVVar2->nSize);
      }
      putchar(10);
    }
    Fra_BmcStop(p->pBmc);
    p->pBmc = (Fra_Bmc_t *)0x0;
    return;
  }
  __assert_fail("p->pBmc == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraBmc.c"
                ,0x13c,"void Fra_BmcPerform(Fra_Man_t *, int, int)");
}

Assistant:

void Fra_BmcPerform( Fra_Man_t * p, int nPref, int nDepth )
{
    Aig_Obj_t * pObj;
    int i, nImpsOld = 0;
    abctime clk = Abc_Clock();
    assert( p->pBmc == NULL );
    // derive and fraig the frames
    p->pBmc = Fra_BmcStart( p->pManAig, nPref, nDepth );
    p->pBmc->pAigFrames = Fra_BmcFrames( p->pBmc, 0 );
    // if implications are present, configure the AIG manager to check them
    if ( p->pCla->vImps )
    {
        p->pBmc->pAigFrames->pImpFunc = (void (*) (void*, void*))Fra_BmcFilterImplications;
        p->pBmc->pAigFrames->pImpData = p->pBmc;
        p->pBmc->vImps = p->pCla->vImps;
        nImpsOld = Vec_IntSize(p->pCla->vImps);
    } 
    p->pBmc->pAigFraig = Fra_FraigEquivence( p->pBmc->pAigFrames, 1000000, 0 );
    p->pBmc->pObjToFraig = p->pBmc->pAigFrames->pObjCopies;
    p->pBmc->pAigFrames->pObjCopies = NULL;
    // annotate frames nodes with pointers to the manager
    Aig_ManForEachObj( p->pBmc->pAigFrames, pObj, i )
        pObj->pData = p;
    // report the results
    if ( p->pPars->fVerbose )
    {
        printf( "Original AIG = %d. Init %d frames = %d. Fraig = %d.  ", 
            Aig_ManNodeNum(p->pBmc->pAig), p->pBmc->nFramesAll, 
            Aig_ManNodeNum(p->pBmc->pAigFrames), Aig_ManNodeNum(p->pBmc->pAigFraig) );
        ABC_PRT( "Time", Abc_Clock() - clk );
        printf( "Before BMC: " );  
//        Fra_ClassesPrint( p->pCla, 0 );
        printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
            Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );
        if ( p->pCla->vImps )
            printf( "Imp = %5d. ", nImpsOld );
        printf( "\n" );
    }
    // refine the classes
    p->pCla->pFuncNodeIsConst   = Fra_BmcNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_BmcNodesAreEqual;
    Fra_ClassesRefine( p->pCla );
    Fra_ClassesRefine1( p->pCla, 1, NULL );
    p->pCla->pFuncNodeIsConst   = Fra_SmlNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_SmlNodesAreEqual;
    // report the results
    if ( p->pPars->fVerbose )
    {
        printf( "After  BMC: " );  
//        Fra_ClassesPrint( p->pCla, 0 );
        printf( "Const = %5d. Class = %5d. Lit = %5d. ", 
            Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), Fra_ClassesCountLits(p->pCla) );
        if ( p->pCla->vImps )
            printf( "Imp = %5d. ", Vec_IntSize(p->pCla->vImps) );
        printf( "\n" );
    }
    // free the BMC manager
    Fra_BmcStop( p->pBmc );  
    p->pBmc = NULL;
}